

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int uv__signal_register_handler(int signum,int oneshot)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  sigaction local_b0;
  
  iVar3 = 0;
  memset(&local_b0,0,0x98);
  iVar1 = sigfillset(&local_b0.sa_mask);
  if (iVar1 == 0) {
    local_b0.__sigaction_handler.sa_handler = uv__signal_handler;
    local_b0.sa_flags = -0x70000000;
    if (oneshot == 0) {
      local_b0.sa_flags = 0x10000000;
    }
    iVar1 = sigaction(signum,&local_b0,(sigaction *)0x0);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      iVar3 = -*piVar2;
    }
    return iVar3;
  }
  abort();
}

Assistant:

static int uv__signal_register_handler(int signum, int oneshot) {
  /* When this function is called, the signal lock must be held. */
  struct sigaction sa;

  /* XXX use a separate signal stack? */
  memset(&sa, 0, sizeof(sa));
  if (sigfillset(&sa.sa_mask))
    abort();
  sa.sa_handler = uv__signal_handler;
  sa.sa_flags = SA_RESTART;
  if (oneshot)
    sa.sa_flags |= SA_RESETHAND;

  /* XXX save old action so we can restore it later on? */
  if (sigaction(signum, &sa, NULL))
    return UV__ERR(errno);

  return 0;
}